

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ringbuffer.h
# Opt level: O0

void __thiscall brotli::RingBuffer::Write(RingBuffer *this,uint8_t *bytes,size_t n)

{
  size_t __src;
  uint8_t *__dest;
  unsigned_long *puVar1;
  unsigned_long local_30;
  ulong local_28;
  size_t masked_pos;
  size_t n_local;
  uint8_t *bytes_local;
  RingBuffer *this_local;
  
  local_28 = (ulong)(this->pos_ & this->mask_);
  masked_pos = n;
  n_local = (size_t)bytes;
  bytes_local = (uint8_t *)this;
  WriteTail(this,bytes,n);
  __src = n_local;
  if ((ulong)this->size_ < local_28 + masked_pos) {
    __dest = this->buffer_ + local_28;
    local_30 = (this->size_ + this->tail_size_) - local_28;
    puVar1 = std::min<unsigned_long>(&masked_pos,&local_30);
    memcpy(__dest,(void *)__src,*puVar1);
    memcpy(this->buffer_,(void *)(n_local + (this->size_ - local_28)),
           masked_pos - (this->size_ - local_28));
  }
  else {
    memcpy(this->buffer_ + local_28,(void *)n_local,masked_pos);
  }
  this->buffer_[-2] = this->buffer_[this->size_ - 2];
  this->buffer_[-1] = this->buffer_[this->size_ - 1];
  this->pos_ = (int)masked_pos + this->pos_;
  if (0x40000000 < this->pos_) {
    this->pos_ = this->pos_ & 0x3fffffff | 0x40000000;
  }
  return;
}

Assistant:

void Write(const uint8_t *bytes, size_t n) {
    const size_t masked_pos = pos_ & mask_;
    // The length of the writes is limited so that we do not need to worry
    // about a write
    WriteTail(bytes, n);
    if (PREDICT_TRUE(masked_pos + n <= size_)) {
      // A single write fits.
      memcpy(&buffer_[masked_pos], bytes, n);
    } else {
      // Split into two writes.
      // Copy into the end of the buffer, including the tail buffer.
      memcpy(&buffer_[masked_pos], bytes,
             std::min(n, (size_ + tail_size_) - masked_pos));
      // Copy into the beginning of the buffer
      memcpy(&buffer_[0], bytes + (size_ - masked_pos),
             n - (size_ - masked_pos));
    }
    buffer_[-2] = buffer_[size_ - 2];
    buffer_[-1] = buffer_[size_ - 1];
    pos_ += static_cast<uint32_t>(n);
    if (pos_ > (1u << 30)) {  /* Wrap, but preserve not-a-first-lap feature. */
      pos_ = (pos_ & ((1u << 30) - 1)) | (1u << 30);
    }
  }